

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void TestLength<unsigned_long_long,int>(char *length_spec,int value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  uint *puVar3;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  bool bVar4;
  char *pcVar5;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ostringstream os;
  uint local_4ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  internal local_488;
  undefined7 uStack_487;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  undefined1 local_478 [16];
  string local_468;
  undefined1 local_448 [32];
  unsigned_long_long local_428;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  local_420;
  locale_ref local_418;
  internal local_408 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  string local_3f8;
  ulong local_3d8 [3];
  AssertHelper local_3c0;
  int *local_3b8;
  AssertHelperData local_3b0 [9];
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_4ac = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::_M_insert<long_long>((longlong)&local_1a8);
  std::__cxx11::stringbuf::str();
  piVar2 = &local_3b0[0].line;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str.size_ = 4;
  format_str.data_ = "%{}d";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
                ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str,args,(locale_ref)0x0);
  paVar1 = &local_4a8.field_2;
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format.size_ = local_4a8._M_string_length;
  format.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}d\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_00.size_ = 4;
    format_str_00.data_ = "%{}d";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_00.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_00,args_00,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_01.size_ = 4;
  format_str_01.data_ = "%{}d";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_01,args_01,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_05.data_._1_7_ = uStack_487;
  format_05.data_._0_1_ = local_488;
  format_05.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_05);
  local_3d8[0] = (ulong)local_4ac;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}d\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_02.size_ = 4;
  format_str_02.data_ = "%{}i";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_02,args_02,(locale_ref)0x0);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_00.size_ = local_4a8._M_string_length;
  format_00.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format_00,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}i\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_03.size_ = 4;
    format_str_03.data_ = "%{}i";
    args_03.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_03.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_03,args_03,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x143,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_04.size_ = 4;
  format_str_04.data_ = "%{}i";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_04,args_04,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_06.data_._1_7_ = uStack_487;
  format_06.data_._0_1_ = local_488;
  format_06.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_06);
  local_3d8[0] = (ulong)local_4ac;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}i\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x143,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0.data_ = local_3b0;
  pcVar5 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"","");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_3c0.data_ != local_3b0) {
    operator_delete(local_3c0.data_);
  }
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_05.size_ = 4;
  format_str_05.data_ = "%{}u";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_05,args_05,(locale_ref)0x0);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_01.size_ = local_4a8._M_string_length;
  format_01.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format_01,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}u\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_06.size_ = 4;
    format_str_06.data_ = "%{}u";
    args_06.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_06.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_06,args_06,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_07.size_ = 4;
  format_str_07.data_ = "%{}u";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_07,args_07,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_07.data_._1_7_ = uStack_487;
  format_07.data_._0_1_ = local_488;
  format_07.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_07);
  local_3d8[0] = (ulong)local_4ac;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}u\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0.data_ = local_3b0;
  pcVar5 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"","");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_3c0.data_ != local_3b0) {
    operator_delete(local_3c0.data_);
  }
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 0x40;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_08.size_ = 4;
  format_str_08.data_ = "%{}o";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_08,args_08,(locale_ref)0x0);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_02.size_ = local_4a8._M_string_length;
  format_02.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format_02,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}o\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_09.size_ = 4;
    format_str_09.data_ = "%{}o";
    args_09.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_09.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_09,args_09,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x149,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_10.size_ = 4;
  format_str_10.data_ = "%{}o";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_10,args_10,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_08.data_._1_7_ = uStack_487;
  format_08.data_._0_1_ = local_488;
  format_08.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_08);
  local_3d8[0] = (ulong)local_4ac;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}o\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x149,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0.data_ = local_3b0;
  pcVar5 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"","");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_3c0.data_ != local_3b0) {
    operator_delete(local_3c0.data_);
  }
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_11.size_ = 4;
  format_str_11.data_ = "%{}x";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_11,args_11,(locale_ref)0x0);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_03.size_ = local_4a8._M_string_length;
  format_03.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format_03,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}x\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_12.size_ = 4;
    format_str_12.data_ = "%{}x";
    args_12.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_12.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_12,args_12,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_13.size_ = 4;
  format_str_13.data_ = "%{}x";
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_13,args_13,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_09.data_._1_7_ = uStack_487;
  format_09.data_._0_1_ = local_488;
  format_09.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_09);
  local_3d8[0] = (ulong)local_4ac;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}x\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0.data_ = local_3b0;
  pcVar5 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"","");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_3c0.data_ != local_3b0) {
    operator_delete(local_3c0.data_);
  }
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
  puVar3 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
  *puVar3 = *puVar3 | 0x4000;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_14.size_ = 4;
  format_str_14.data_ = "%{}X";
  args_14.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_14.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_3f8._M_dataplus._M_p = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_14,args_14,(locale_ref)0x0);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_04.size_ = local_4a8._M_string_length;
  format_04.data_ = local_4a8._M_dataplus._M_p;
  test_sprintf<int>(&local_468,format_04,(int *)&local_4ac);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (&local_488,"os.str()","test_sprintf(fmt::format(\"%{}X\", length_spec), value)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
             &local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_);
  }
  if (local_488 == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),"format: ",8);
    local_3b0[0]._0_8_ = 0;
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    local_3b0[0].file = (char *)0x1f4;
    format_str_15.size_ = 4;
    format_str_15.data_ = "%{}X";
    args_15.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_15.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    local_468._M_dataplus._M_p = length_spec;
    local_3b8 = piVar2;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3c0,format_str_15,args_15,(locale_ref)0x0);
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
    local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
    if (local_3b8 != piVar2) {
      operator_delete(local_3b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_4a8._M_dataplus._M_p + 0x10),(char *)local_448._0_8_,
               local_448._8_8_);
    if (local_480.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_480.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_480,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringbuf::str();
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  format_str_16.size_ = 4;
  format_str_16.data_ = "%{}X";
  args_16.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_448;
  args_16.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
       ::TYPES;
  local_448._0_8_ = length_spec;
  local_3b8 = piVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3c0,format_str_16,args_16,(locale_ref)0x0);
  local_488 = SUB81(local_478,0);
  uStack_487 = (undefined7)((ulong)local_478 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  format_10.data_._1_7_ = uStack_487;
  format_10.data_._0_1_ = local_488;
  format_10.size_ = (size_t)local_480.ptr_;
  make_positional_abi_cxx11_(&local_3f8,format_10);
  local_3d8[0] = (ulong)local_4ac;
  local_3b0[0]._0_8_ = 0;
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  local_3b0[0].file = (char *)0x1f4;
  local_448._0_8_ = local_3f8._M_dataplus._M_p;
  local_448._8_8_ = local_3f8._M_string_length;
  local_448._16_4_ = 0;
  local_428 = fmt::v5::
              format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
              ::TYPES;
  local_420.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_3d8;
  local_418.locale_ = (void *)0x0;
  local_448._24_8_ = (basic_buffer<char> *)&local_3c0;
  local_3b8 = piVar2;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_448);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,local_3b8,(undefined1 *)((long)local_3b8 + local_3b0[0]._0_8_));
  local_3c0.data_ = (AssertHelperData *)&PTR_grow_0023bf40;
  if (local_3b8 != piVar2) {
    operator_delete(local_3b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"os.str()",
             "fmt::sprintf(make_positional(fmt::format(\"%{}X\", length_spec)), value)",&local_468,
             &local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    if (local_400.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_400.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_448,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void TestLength(const char *length_spec, U value) {
  long long signed_value = 0;
  unsigned long long unsigned_value = 0;
  // Apply integer promotion to the argument.
  using std::numeric_limits;
  unsigned long long max = numeric_limits<U>::max();
  using fmt::internal::const_check;
  if (const_check(max <= static_cast<unsigned>(numeric_limits<int>::max()))) {
    signed_value = static_cast<int>(value);
    unsigned_value = static_cast<unsigned>(value);
  } else if (const_check(max <= numeric_limits<unsigned>::max())) {
    signed_value = static_cast<unsigned>(value);
    unsigned_value = static_cast<unsigned>(value);
  }
  if (sizeof(U) <= sizeof(int) && sizeof(int) < sizeof(T)) {
    signed_value = static_cast<long long>(value);
    unsigned_value =
        static_cast<typename std::make_unsigned<unsigned>::type>(value);
  } else {
    signed_value = static_cast<typename make_signed<T>::type>(value);
    unsigned_value = static_cast<typename std::make_unsigned<T>::type>(value);
  }
  std::ostringstream os;
  os << signed_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}d", length_spec), value);
  EXPECT_PRINTF(os.str(), fmt::format("%{}i", length_spec), value);
  os.str("");
  os << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}u", length_spec), value);
  os.str("");
  os << std::oct << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}o", length_spec), value);
  os.str("");
  os << std::hex << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}x", length_spec), value);
  os.str("");
  os << std::hex << std::uppercase << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}X", length_spec), value);
}